

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.h
# Opt level: O1

pair<const_int,_int> * __thiscall
frozen::bits::LowerBound<int,frozen::impl::CompareKey<std::less<int>>>::
doitfirst<std::pair<int_const,int>const*,128ul>
          (LowerBound<int,frozen::impl::CompareKey<std::less<int>>> *this,long first)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  iVar1 = **(int **)this;
  if (*(int *)(first + 0x1f8) < iVar1) {
    if (*(int *)(first + 0x2f8) < iVar1) {
      if (*(int *)(first + 0x378) < iVar1) {
        if (*(int *)(first + 0x3b8) < iVar1) {
          if (*(int *)(first + 0x3d8) < iVar1) {
            if (*(int *)(first + 1000) < iVar1) {
              if (iVar1 <= *(int *)(first + 0x3f0)) {
                return (pair<const_int,_int> *)(first + 0x3f0);
              }
              piVar2 = (int *)(first + 0x3f8);
            }
            else {
              piVar2 = (int *)(first + 0x3e0);
            }
          }
          else {
            piVar2 = (int *)(first + (ulong)(*(int *)(first + 0x3c8) < iVar1) * 0x10 + 0x3c0);
          }
        }
        else {
          lVar5 = (ulong)(*(int *)(first + 0x398) < iVar1) * 0x20;
          piVar2 = (int *)(first + lVar5 + (ulong)(*(int *)(first + 0x388 + lVar5) < iVar1) * 0x10 +
                          0x380);
        }
      }
      else {
        lVar4 = (ulong)(*(int *)(first + 0x338) < iVar1) * 0x40;
        lVar5 = first + lVar4;
        lVar4 = (ulong)(*(int *)(first + 0x318 + lVar4) < iVar1) * 0x20;
        piVar2 = (int *)((ulong)(*(int *)(lVar4 + 0x308 + lVar5) < iVar1) * 0x10 + lVar5 + lVar4 +
                        0x300);
      }
    }
    else {
      lVar4 = (ulong)(*(int *)(first + 0x278) < iVar1) * 0x80;
      lVar5 = first + lVar4;
      lVar3 = (ulong)(*(int *)(first + 0x238 + lVar4) < iVar1) * 0x40;
      lVar4 = lVar5 + lVar3;
      lVar5 = (ulong)(*(int *)(lVar3 + 0x218 + lVar5) < iVar1) * 0x20;
      piVar2 = (int *)((ulong)(*(int *)(lVar5 + 0x208 + lVar4) < iVar1) * 0x10 + lVar4 + lVar5 +
                      0x200);
    }
  }
  else {
    lVar4 = (ulong)(*(int *)(first + 0xf8) < iVar1) * 0x100;
    lVar5 = first + lVar4;
    lVar3 = (ulong)(*(int *)(first + 0x78 + lVar4) < iVar1) * 0x80;
    lVar4 = lVar5 + lVar3;
    lVar3 = (ulong)(*(int *)(lVar3 + 0x38 + lVar5) < iVar1) * 0x40;
    lVar5 = lVar4 + lVar3;
    lVar4 = (ulong)(*(int *)(lVar3 + 0x18 + lVar4) < iVar1) * 0x20;
    piVar2 = (int *)((ulong)(*(int *)(lVar4 + 8 + lVar5) < iVar1) * 0x10 + lVar5 + lVar4);
  }
  return (pair<const_int,_int> *)(piVar2 + (ulong)(*piVar2 < iVar1) * 2);
}

Assistant:

inline constexpr ForwardIt doitfirst(ForwardIt first, std::integral_constant<std::size_t, N>, std::integral_constant<bool, false>) {
    auto constexpr next_power = next_highest_power_of_two(N);
    auto constexpr next_start = next_power / 2 - 1;
    auto it = first + next_start;
    if (compare_(*it, value_)) {
      auto constexpr next = N - next_start - 1;
      return doitfirst(it + 1, std::integral_constant<std::size_t, next>{}, std::integral_constant<bool, next_highest_power_of_two(next) - 1 == next>{});
    }
    else
      return doit_fast(first, std::integral_constant<std::size_t, next_start>{});
  }